

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O0

size_t sei_render(sei_t *sei,uint8_t *data)

{
  undefined1 *puVar1;
  sei_msgtype_t sVar2;
  int iVar3;
  sei_message_t *msg_00;
  size_t sVar4;
  undefined1 *in_RSI;
  sei_t *in_RDI;
  uint8_t *payloadData;
  int payloadSize;
  int payloadType;
  sei_message_t *msg;
  size_t size;
  size_t escaped_size;
  undefined1 *local_18;
  uint8_t *local_8;
  
  if ((in_RDI == (sei_t *)0x0) || (in_RDI->head == (sei_message_t *)0x0)) {
    local_8 = (uint8_t *)0x0;
  }
  else {
    local_8 = (uint8_t *)0x2;
    *in_RSI = 6;
    local_18 = in_RSI + 1;
    for (msg_00 = sei_message_head(in_RDI); msg_00 != (sei_message_t *)0x0;
        msg_00 = sei_message_next(msg_00)) {
      sVar2 = sei_message_type(msg_00);
      sVar4 = sei_message_size(msg_00);
      iVar3 = (int)sVar4;
      sei_message_data(msg_00);
      for (; 0xfe < (int)sVar2; sVar2 = sVar2 - 0xff) {
        *local_18 = 0xff;
        local_18 = local_18 + 1;
        local_8 = local_8 + 1;
      }
      *local_18 = (char)sVar2;
      puVar1 = local_18;
      while( true ) {
        local_18 = puVar1 + 1;
        if (iVar3 < 0xff) break;
        *local_18 = 0xff;
        iVar3 = iVar3 + -0xff;
        local_8 = local_8 + 1;
        puVar1 = local_18;
      }
      *local_18 = (char)iVar3;
      local_8 = local_8 + 2;
      sVar4 = _copy_from_rbsp(local_8,(uint8_t *)msg_00,CONCAT44(sVar2,iVar3));
      if (sVar4 == 0) {
        return 0;
      }
      local_18 = puVar1 + sVar4 + 2;
      local_8 = local_8 + sVar4;
    }
    *local_18 = 0x80;
  }
  return (size_t)local_8;
}

Assistant:

size_t sei_render(sei_t* sei, uint8_t* data)
{
    if (!sei || !sei->head) {
        return 0;
    }

    size_t escaped_size, size = 2; // nalu_type + stop bit
    sei_message_t* msg;
    (*data) = 6;
    ++data;

    for (msg = sei_message_head(sei); msg; msg = sei_message_next(msg)) {
        int payloadType = sei_message_type(msg);
        int payloadSize = (int)sei_message_size(msg);
        uint8_t* payloadData = sei_message_data(msg);

        while (255 <= payloadType) {
            (*data) = 255;
            ++data;
            ++size;
            payloadType -= 255;
        }

        (*data) = payloadType;
        ++data;
        ++size;

        while (255 <= payloadSize) {
            (*data) = 255;
            ++data;
            ++size;
            payloadSize -= 255;
        }

        (*data) = payloadSize;
        ++data;
        ++size;

        if (0 >= (escaped_size = _copy_from_rbsp(data, payloadData, payloadSize))) {
            return 0;
        }

        data += escaped_size;
        size += escaped_size;
    }

    // write stop bit and return
    (*data) = 0x80;
    return size;
}